

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O2

int run_test_semaphore_3(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_30;
  uv_sem_t sem;
  
  iVar1 = uv_sem_init(&sem,3);
  if (iVar1 == 0) {
    uv_sem_wait(&sem);
    uv_sem_wait(&sem);
    iVar1 = uv_sem_trywait(&sem);
    if (iVar1 == 0) {
      iVar1 = uv_sem_trywait(&sem);
      if (iVar1 == -0xb) {
        uv_sem_post(&sem);
        iVar1 = uv_sem_trywait(&sem);
        if (iVar1 == 0) {
          iVar1 = uv_sem_trywait(&sem);
          if (iVar1 == -0xb) {
            uv_sem_destroy(&sem);
            return 0;
          }
          pcVar2 = "UV_EAGAIN == uv_sem_trywait(&sem)";
          uStack_30 = 0x6a;
        }
        else {
          pcVar2 = "0 == uv_sem_trywait(&sem)";
          uStack_30 = 0x69;
        }
      }
      else {
        pcVar2 = "UV_EAGAIN == uv_sem_trywait(&sem)";
        uStack_30 = 0x66;
      }
    }
    else {
      pcVar2 = "0 == uv_sem_trywait(&sem)";
      uStack_30 = 0x65;
    }
  }
  else {
    pcVar2 = "0 == uv_sem_init(&sem, 3)";
    uStack_30 = 0x62;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
          ,uStack_30,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT(0 == uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}